

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void Console::Prompt::Private::handleWinch(int sig)

{
  undefined8 local_18;
  uint64 event;
  int eventFd;
  int sig_local;
  
  event._0_4_ = resizeEventFd;
  if (resizeEventFd != 0) {
    local_18 = 1;
    event._4_4_ = sig;
    write(resizeEventFd,&local_18,8);
  }
  return;
}

Assistant:

static void handleWinch(int sig)
  {
#ifndef __CYGWIN__
    int eventFd = resizeEventFd;
#else
    int eventFd = resizeEventFdWrite;
#endif
    if(eventFd)
    {
      uint64 event = 1;
      if(write(eventFd, &event, sizeof(uint64)) != sizeof(uint64))
        return;
    }
  }